

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O3

GameplayDisplayer * GameplayDisplayer::getInstance(void)

{
  GameplayDisplayer *pGVar1;
  Palette *pPVar2;
  PrimitiveDisplayer *pPVar3;
  
  if (gameplayDisplayer == (GameplayDisplayer *)0x0) {
    pGVar1 = (GameplayDisplayer *)operator_new(0x18);
    pGVar1->pixelSize = 0x1e;
    pPVar2 = Palette::getInstance();
    pGVar1->palette = pPVar2;
    pPVar3 = PrimitiveDisplayer::getInstance();
    pGVar1->primitiveDisplayer = pPVar3;
    gameplayDisplayer = pGVar1;
  }
  return gameplayDisplayer;
}

Assistant:

GameplayDisplayer* GameplayDisplayer::getInstance() {
    if (gameplayDisplayer == nullptr) {
        gameplayDisplayer = new GameplayDisplayer();
    }
    return gameplayDisplayer;
}